

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slist.c
# Opt level: O0

curl_slist * Curl_slist_duplicate(curl_slist *inlist)

{
  curl_slist *pcVar1;
  curl_slist *tmp;
  curl_slist *outlist;
  curl_slist *inlist_local;
  
  tmp = (curl_slist *)0x0;
  outlist = inlist;
  while( true ) {
    if (outlist == (curl_slist *)0x0) {
      return tmp;
    }
    pcVar1 = curl_slist_append(tmp,outlist->data);
    if (pcVar1 == (curl_slist *)0x0) break;
    outlist = outlist->next;
    tmp = pcVar1;
  }
  curl_slist_free_all(tmp);
  return (curl_slist *)0x0;
}

Assistant:

struct curl_slist *Curl_slist_duplicate(struct curl_slist *inlist)
{
  struct curl_slist *outlist = NULL;
  struct curl_slist *tmp;

  while(inlist) {
    tmp = curl_slist_append(outlist, inlist->data);

    if(!tmp) {
      curl_slist_free_all(outlist);
      return NULL;
    }

    outlist = tmp;
    inlist = inlist->next;
  }
  return outlist;
}